

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

int Amap_LibNumPinsMax(Amap_Lib_t *p)

{
  int iVar1;
  void *pvVar2;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Amap_Gat_t *pGate;
  Amap_Lib_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vGates), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vGates,local_1c);
    if (local_20 < *(uint *)((long)pvVar2 + 0x38) >> 0x18) {
      local_20 = *(uint *)((long)pvVar2 + 0x38) >> 0x18;
    }
  }
  return local_20;
}

Assistant:

int Amap_LibNumPinsMax( Amap_Lib_t * p )
{
    Amap_Gat_t * pGate;
    int i, Counter = 0;
    Amap_LibForEachGate( p, pGate, i )
        if ( Counter < (int)pGate->nPins )
            Counter = pGate->nPins;
    return Counter;
}